

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::StaticInitializerVisitor::visit<slang::ast::ConversionExpression>
          (StaticInitializerVisitor *this,ConversionExpression *expr)

{
  ExpressionKind EVar1;
  SymbolKind SVar2;
  SystemSubroutine *pSVar3;
  optional<bool> oVar4;
  int iVar5;
  Symbol *this_00;
  Expression *pEVar6;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar7;
  Diagnostic *this_01;
  Diagnostic *this_02;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar8;
  SourceLocation SVar9;
  DiagCode code;
  ASTContext *this_03;
  size_t i_1;
  size_t i;
  SourceLocation SVar11;
  bool bVar12;
  ArgList AVar13;
  SourceRange sourceRange;
  SourceLocation SVar10;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 - NamedValue < 2) {
    this_00 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (this_00 != (Symbol *)0x0) {
      SVar2 = this_00->kind;
      if ((SVar2 == ModportPort) || (SVar2 == Net)) {
        this_03 = this->context;
        SVar10 = (expr->super_Expression).sourceRange.startLoc;
        SVar9 = (expr->super_Expression).sourceRange.endLoc;
        code.subsystem = Declarations;
        code.code = 0xf8;
LAB_00348f26:
        sourceRange.endLoc = SVar9;
        sourceRange.startLoc = SVar10;
        this_01 = ASTContext::addDiag(this_03,code,sourceRange);
        this_02 = Diagnostic::operator<<(this_01,this->sourceVar->name);
        Diagnostic::operator<<(this_02,this_00->name);
        Diagnostic::addNote(this_01,(DiagCode)0x50001,this_00->location);
        return;
      }
      if ((SVar2 == Variable) && (this_00 != this->sourceVar)) {
        pEVar6 = DeclaredType::getInitializer((DeclaredType *)(this_00 + 1));
        bVar12 = this_00[5].name._M_len != 0;
        oVar4 = Symbol::isDeclaredBefore(this_00,this->sourceVar);
        if ((bVar12 || pEVar6 == (Expression *)0x0) ||
           ((((ushort)oVar4.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 0x100) == 0 ||
            (((ushort)oVar4.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 1) == 0)))) {
          code = (DiagCode)((uint)(bVar12 || pEVar6 == (Expression *)0x0) * 0x10000 + 0xf70006);
          this_03 = this->context;
          SVar10 = (expr->super_Expression).sourceRange.startLoc;
          SVar9 = (expr->super_Expression).sourceRange.endLoc;
          goto LAB_00348f26;
        }
      }
    }
  }
  else if (EVar1 == Call) {
    CallExpression::visitExprsNoArgs<slang::ast::StaticInitializerVisitor&>
              ((CallExpression *)expr,this);
    if (*(char *)&expr[1].super_Expression.constant == '\x01') {
      pvVar7 = std::
               get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                         ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                           *)&expr->conversionKind);
      pSVar3 = (pvVar7->subroutine).ptr;
      SVar10 = expr[1].super_Expression.sourceRange.startLoc;
      SVar9 = expr[1].super_Expression.sourceRange.endLoc;
      for (SVar11 = (SourceLocation)0x0; SVar9 != SVar11;
          SVar11 = (SourceLocation)((long)SVar11 + 1)) {
        iVar5 = (*pSVar3->_vptr_SystemSubroutine[4])(pSVar3,SVar11);
        if ((char)iVar5 == '\0') {
          Expression::visit<slang::ast::StaticInitializerVisitor&>
                    (*(Expression **)((long)SVar10 + (long)SVar11 * 8),this);
        }
      }
    }
    else {
      ppSVar8 = std::
                get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)&expr->conversionKind);
      AVar13 = SubroutineSymbol::getArguments(*ppSVar8);
      SVar10 = expr[1].super_Expression.sourceRange.startLoc;
      SVar9 = expr[1].super_Expression.sourceRange.endLoc;
      for (SVar11 = (SourceLocation)0x0; SVar9 != SVar11;
          SVar11 = (SourceLocation)((long)SVar11 + 1)) {
        if (AVar13._M_ptr[(long)SVar11]->direction == In) {
          Expression::visit<slang::ast::StaticInitializerVisitor&>
                    (*(Expression **)((long)SVar10 + (long)SVar11 * 8),this);
        }
      }
    }
  }
  else if (EVar1 != NewCovergroup) {
    ConversionExpression::visitExprs<slang::ast::StaticInitializerVisitor&>(expr,this);
    return;
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::Variable) {
                            // Don't warn if this is the same var.
                            auto& var = sym->template as<VariableSymbol>();
                            if (&var == &sourceVar)
                                return;

                            const bool hasInit = var.getInitializer();
                            const bool isFromPort = var.getFirstPortBackref();
                            const bool isDeclaredBefore = var.isDeclaredBefore(sourceVar).value_or(
                                false);

                            // We warn unless this var has an initializer, is declared
                            // before us in the same instance, and isn't attached to a port.
                            if (hasInit && !isFromPort && isDeclaredBefore)
                                return;

                            auto code = (hasInit && !isFromPort) ? diag::StaticInitOrder
                                                                 : diag::StaticInitValue;
                            auto& diag = context.addDiag(code, expr.sourceRange);
                            diag << sourceVar.name << var.name;
                            diag.addNote(diag::NoteDeclarationHere, var.location);
                        }
                        else if (sym->kind == SymbolKind::Net ||
                                 sym->kind == SymbolKind::ModportPort) {
                            auto& diag = context.addDiag(diag::StaticInitValue, expr.sourceRange);
                            diag << sourceVar.name << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    call.visitExprsNoArgs(*this);

                    if (call.isSystemCall()) {
                        // Ignore unevaluated arguments to system calls.
                        auto& sub = *std::get<1>(call.subroutine).subroutine;
                        auto args = call.arguments();
                        for (size_t i = 0; i < args.size(); i++) {
                            if (!sub.isArgUnevaluated(i))
                                args[i]->visit(*this);
                        }
                    }
                    else {
                        // Skip over output, inout, and ref args.
                        auto& sub = *std::get<0>(call.subroutine);
                        auto formals = sub.getArguments();
                        auto args = call.arguments();
                        SLANG_ASSERT(formals.size() == args.size());
                        for (size_t i = 0; i < args.size(); i++) {
                            if (formals[i]->direction == ArgumentDirection::In)
                                args[i]->visit(*this);
                        }
                    }
                    break;
                }
                case ExpressionKind::NewCovergroup:
                    // Ignore new covergroup expressions.
                    break;
                default:
                    if constexpr (HasVisitExprs<T, StaticInitializerVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }